

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_sequence_containers.h
# Opt level: O0

vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
* testinator::Arbitrary<std::forward_list<int,_std::allocator<int>_>_>::shrink
            (vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
             *__return_storage_ptr__,output_type *t)

{
  _Fwd_list_const_iterator<int> __first;
  bool bVar1;
  const_iterator cVar2;
  const_iterator __last;
  difference_type dVar3;
  reference pvVar4;
  reference __val;
  front_insert_iterator<std::forward_list<int,_std::allocator<int>_>_> __result;
  _Fwd_list_impl local_70;
  _Fwd_list_node_base *local_68;
  int local_5c;
  _Fwd_list_impl _Stack_58;
  int count;
  _Fwd_list_const_iterator<int> local_50;
  const_iterator it;
  difference_type l;
  output_type *t_local;
  vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
  *v;
  
  ::std::
  vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
  ::vector(__return_storage_ptr__);
  bVar1 = ::std::forward_list<int,_std::allocator<int>_>::empty(t);
  if (!bVar1) {
    cVar2 = ::std::forward_list<int,_std::allocator<int>_>::cbegin(t);
    __last = ::std::forward_list<int,_std::allocator<int>_>::cend(t);
    dVar3 = ::std::distance<std::_Fwd_list_const_iterator<int>>
                      ((_Fwd_list_const_iterator<int>)cVar2._M_node,
                       (_Fwd_list_const_iterator<int>)__last._M_node);
    local_50._M_node =
         (_Fwd_list_node_base *)::std::forward_list<int,_std::allocator<int>_>::cbegin(t);
    _Stack_58._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
    ::std::forward_list<int,_std::allocator<int>_>::forward_list
              ((forward_list<int,_std::allocator<int>_> *)&stack0xffffffffffffffa8);
    ::std::
    vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
    ::push_back(__return_storage_ptr__,
                (forward_list<int,_std::allocator<int>_> *)&stack0xffffffffffffffa8);
    ::std::forward_list<int,_std::allocator<int>_>::~forward_list
              ((forward_list<int,_std::allocator<int>_> *)&stack0xffffffffffffffa8);
    local_5c = 0;
    while ((long)local_5c < dVar3 / 2) {
      pvVar4 = ::std::
               vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
               ::operator[](__return_storage_ptr__,0);
      __val = ::std::_Fwd_list_const_iterator<int>::operator*(&local_50);
      ::std::forward_list<int,_std::allocator<int>_>::push_front(pvVar4,__val);
      local_5c = local_5c + 1;
      local_68 = (_Fwd_list_node_base *)
                 ::std::_Fwd_list_const_iterator<int>::operator++(&local_50,0);
    }
    if (0 < dVar3 / 2) {
      local_70._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
      ::std::forward_list<int,_std::allocator<int>_>::forward_list
                ((forward_list<int,_std::allocator<int>_> *)&local_70);
      ::std::
      vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&local_70);
      ::std::forward_list<int,_std::allocator<int>_>::~forward_list
                ((forward_list<int,_std::allocator<int>_> *)&local_70);
      __first._M_node = local_50._M_node;
      cVar2 = ::std::forward_list<int,_std::allocator<int>_>::cend(t);
      pvVar4 = ::std::
               vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
               ::operator[](__return_storage_ptr__,1);
      __result = ::std::front_inserter<std::forward_list<int,std::allocator<int>>>(pvVar4);
      ::std::
      copy<std::_Fwd_list_const_iterator<int>,std::front_insert_iterator<std::forward_list<int,std::allocator<int>>>>
                (__first,(_Fwd_list_const_iterator<int>)cVar2._M_node,__result);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<output_type> shrink(const output_type& t)
    {
      std::vector<output_type> v;
      if (t.empty()) return v;
      auto l = std::distance(t.cbegin(), t.cend()) / 2;
      auto it = t.cbegin();
      v.push_back(output_type());
      for (auto count = 0; count < l; count++, it++)
        v[0].push_front(*it);
      if (l > 0)
      {
        v.push_back(output_type());
        copy(it, t.cend(), std::front_inserter(v[1]));
      }
      return v;
    }